

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void * __thiscall dgMeshEffect::GetNextEdge(dgMeshEffect *this,void *edge)

{
  int iVar1;
  dgTreeNode *node;
  Iterator local_20;
  
  iVar1 = *(int *)((long)edge + 0x50);
  local_20.m_ptr = (dgRedBackNode *)edge;
  local_20.m_tree = (dgTree<dgEdge,_long> *)this;
  do {
    dgTree<dgEdge,_long>::Iterator::operator++(&local_20,0);
    if (local_20.m_ptr == (dgRedBackNode *)0x0) {
      return local_20.m_ptr;
    }
  } while (*(int *)&local_20.m_ptr[2]._vptr_dgRedBackNode == iVar1);
  *(int *)&local_20.m_ptr[2]._vptr_dgRedBackNode = iVar1;
  *(int *)(*(long *)&local_20.m_ptr[1].field_0x20 + 0x28) = iVar1;
  return local_20.m_ptr;
}

Assistant:

void* dgMeshEffect::GetNextEdge (const void* const edge)
{
	dgTreeNode* node = (dgTreeNode*) edge;
	hacd::HaI32 mark = node->GetInfo().m_mark;

	Iterator iter (*this);
	iter.Set (node);
	for (iter ++; iter; iter ++) {
		dgTreeNode* node = iter.GetNode();
		if (node->GetInfo().m_mark != mark) {
			node->GetInfo().m_mark = mark;
			node->GetInfo().m_twin->m_mark = mark;
			return node; 
		}
	}
	return NULL; 
}